

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

void __thiscall
helics::CloneFilterOperation::setString
          (CloneFilterOperation *this,string_view property,string_view val)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  string_view message;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 in_RDX;
  undefined8 in_RSI;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fnd_1;
  handle handle_2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fnd;
  handle handle_1;
  handle handle;
  shared_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  *in_stack_fffffffffffffdd8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffde8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffdf0;
  InvalidParameter *this_01;
  const_iterator in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  *plVar2;
  size_t in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c9;
  InvalidParameter local_1a1 [2];
  __sv_type local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  local_100;
  undefined8 local_d8;
  undefined8 local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  local_a8;
  undefined8 local_80;
  undefined8 local_78;
  lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  local_60 [3];
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDX;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             in_stack_fffffffffffffdf0._M_current,(char *)in_stack_fffffffffffffde8);
  __x._M_str = (char *)in_stack_fffffffffffffe10;
  __x._M_len = in_stack_fffffffffffffe08;
  __y._M_str = in_stack_fffffffffffffe00;
  __y._M_len = (size_t)in_stack_fffffffffffffdf8._M_current;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    plVar2 = local_60;
    gmlc::libguarded::
    shared_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
    ::lock(in_stack_fffffffffffffdd8);
    gmlc::libguarded::
    lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
    ::operator->(plVar2);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x2da4fb);
    gmlc::libguarded::
    lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
    ::operator->(plVar2);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffdf0._M_current,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8);
    gmlc::libguarded::
    lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
    ::~lock_handle((lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
                    *)0x2da524);
  }
  else {
    local_80 = local_10;
    local_78 = local_8;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               in_stack_fffffffffffffdf0._M_current,(char *)in_stack_fffffffffffffde8);
    __x_00._M_str = (char *)in_stack_fffffffffffffe10;
    __x_00._M_len = in_stack_fffffffffffffe08;
    __y_00._M_str = in_stack_fffffffffffffe00;
    __y_00._M_len = (size_t)in_stack_fffffffffffffdf8._M_current;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      gmlc::libguarded::
      shared_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::lock(in_stack_fffffffffffffdd8);
      gmlc::libguarded::
      lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::operator->(&local_a8);
      bVar1 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffdf0._M_current);
      if (bVar1) {
        gmlc::libguarded::
        lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
        ::operator->(&local_a8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffdf0._M_current,
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8);
      }
      else {
        plVar2 = &local_a8;
        gmlc::libguarded::
        lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
        ::operator->(plVar2);
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CLI::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::cbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffdd8);
        gmlc::libguarded::
        lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
        ::operator->(plVar2);
        local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CLI::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::cend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffdd8);
        local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::basic_string_view<char,std::char_traits<char>>>
                             (in_stack_fffffffffffffdf8._M_current,in_stack_fffffffffffffdf0,
                              in_stack_fffffffffffffde8);
        gmlc::libguarded::
        lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
        ::operator->(&local_a8);
        local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CLI::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::cend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffdd8);
        bVar1 = __gnu_cxx::
                operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          (in_stack_fffffffffffffde0,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffdd8);
        if (bVar1) {
          gmlc::libguarded::
          lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
          ::operator->(&local_a8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffdf0._M_current,
                     (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde8);
        }
      }
      gmlc::libguarded::
      lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::~lock_handle((lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
                      *)0x2da701);
    }
    else {
      local_d8 = local_10;
      local_d0 = local_8;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_fffffffffffffdf0._M_current,(char *)in_stack_fffffffffffffde8);
      __x_01._M_str = (char *)in_stack_fffffffffffffe10;
      __x_01._M_len = in_stack_fffffffffffffe08;
      __y_01._M_str = in_stack_fffffffffffffe00;
      __y_01._M_len = (size_t)in_stack_fffffffffffffdf8._M_current;
      bVar1 = std::operator==(__x_01,__y_01);
      if (!bVar1) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x28);
        this_01 = local_1a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                   (allocator<char> *)in_stack_fffffffffffffe10);
        this_00 = &local_1c9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (in_stack_fffffffffffffe20,
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe18,
                   (allocator<char> *)in_stack_fffffffffffffe10);
        std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        std::operator+(__lhs,(char *)this_00);
        local_140 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
        message._M_str = in_stack_fffffffffffffe00;
        message._M_len = (size_t)in_stack_fffffffffffffdf8._M_current;
        InvalidParameter::InvalidParameter(this_01,message);
        __cxa_throw(__lhs,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
      }
      plVar2 = &local_100;
      gmlc::libguarded::
      shared_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::lock(in_stack_fffffffffffffdd8);
      gmlc::libguarded::
      lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::operator->(plVar2);
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CLI::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::cbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffdd8);
      gmlc::libguarded::
      lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::operator->(plVar2);
      local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CLI::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::cend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffdd8);
      local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::basic_string_view<char,std::char_traits<char>>>
                            (in_stack_fffffffffffffdf8._M_current,in_stack_fffffffffffffdf0,
                             in_stack_fffffffffffffde8);
      gmlc::libguarded::
      lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::operator->(&local_100);
      local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CLI::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::cend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffdd8);
      bVar1 = __gnu_cxx::
              operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        (in_stack_fffffffffffffde0,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffdd8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        gmlc::libguarded::
        lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
        ::operator->(&local_100);
        local_128 = local_108;
        local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CLI::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::erase(in_stack_fffffffffffffdf0._M_current,in_stack_fffffffffffffdf8);
      }
      gmlc::libguarded::
      lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::~lock_handle((lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
                      *)0x2da898);
    }
  }
  return;
}

Assistant:

void CloneFilterOperation::setString(std::string_view property, std::string_view val)
{
    if (property == "delivery") {
        auto handle = deliveryAddresses.lock();
        handle->clear();
        handle->emplace_back(val);
    } else if (property == "add delivery") {
        auto handle = deliveryAddresses.lock();
        if (handle->empty()) {
            handle->emplace_back(val);
        } else {
            auto fnd = std::find(handle->cbegin(), handle->cend(), val);
            if (fnd == handle->cend()) {
                handle->emplace_back(val);
            }
        }
    } else if (property == "remove delivery") {
        auto handle = deliveryAddresses.lock();
        auto fnd = std::find(handle->cbegin(), handle->cend(), val);
        if (fnd != handle->cend()) {
            handle->erase(fnd);
        }
    } else {
        throw(helics::InvalidParameter(std::string(
            std::string("property ") + std::string(property) + " is not a known property")));
    }
}